

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_io_del_(event_base *base,int fd,event *ev)

{
  void *pvVar1;
  int iVar2;
  void *extra;
  int local_50;
  short old;
  short res;
  int retval;
  int nclose;
  int nwrite;
  int nread;
  evmap_io *ctx;
  event_signal_map *io;
  eventop *evsel;
  event *ev_local;
  int fd_local;
  event_base *base_local;
  
  local_50 = 0;
  extra._6_2_ = 0;
  extra._4_2_ = 0;
  if (fd < 0) {
    base_local._4_4_ = 0;
  }
  else {
    if (fd != ev->ev_fd) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x16d,"fd == ev->ev_fd","evmap_io_del_");
    }
    if (fd < (base->io).nentries) {
      pvVar1 = (base->io).entries[fd];
      nclose = (int)*(ushort *)((long)pvVar1 + 8);
      retval = (int)*(ushort *)((long)pvVar1 + 10);
      _old = (uint)*(ushort *)((long)pvVar1 + 0xc);
      if (nclose != 0) {
        extra._4_2_ = 2;
      }
      if (retval != 0) {
        extra._4_2_ = extra._4_2_ | 4;
      }
      if (_old != 0) {
        extra._4_2_ = extra._4_2_ | 0x80;
      }
      if ((ev->ev_events & 2U) != 0) {
        nclose = nclose - 1;
        if (nclose == 0) {
          extra._6_2_ = 2;
        }
        if (nclose < 0) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                     ,0x184,"nread >= 0","evmap_io_del_");
        }
      }
      if ((ev->ev_events & 4U) != 0) {
        retval = retval - 1;
        if (retval == 0) {
          extra._6_2_ = extra._6_2_ | 4;
        }
        if (retval < 0) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                     ,0x189,"nwrite >= 0","evmap_io_del_");
        }
      }
      if ((ev->ev_events & 0x80U) != 0) {
        _old = _old - 1;
        if (_old == 0) {
          extra._6_2_ = extra._6_2_ | 0x80;
        }
        if ((int)_old < 0) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                     ,0x18e,"nclose >= 0","evmap_io_del_");
        }
      }
      if (extra._6_2_ != 0) {
        iVar2 = (*base->evsel->del)(base,ev->ev_fd,extra._4_2_,ev->ev_events & 0x20U | extra._6_2_,
                                    (void *)((long)pvVar1 + 0x10));
        if (iVar2 == -1) {
          local_50 = -1;
        }
        else {
          local_50 = 1;
        }
      }
      *(short *)((long)pvVar1 + 8) = (short)nclose;
      *(short *)((long)pvVar1 + 10) = (short)retval;
      *(short *)((long)pvVar1 + 0xc) = (short)_old;
      if ((ev->ev_).ev_io.ev_io_next.le_next != (event *)0x0) {
        (((ev->ev_).ev_io.ev_io_next.le_next)->ev_).ev_io.ev_io_next.le_prev =
             (ev->ev_).ev_io.ev_io_next.le_prev;
      }
      *(ev->ev_).ev_io.ev_io_next.le_prev = (ev->ev_).ev_io.ev_io_next.le_next;
      base_local._4_4_ = local_50;
    }
    else {
      base_local._4_4_ = -1;
    }
  }
  return base_local._4_4_;
}

Assistant:

int
evmap_io_del_(struct event_base *base, evutil_socket_t fd, struct event *ev)
{
	const struct eventop *evsel = base->evsel;
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx;
	int nread, nwrite, nclose, retval = 0;
	short res = 0, old = 0;

	if (fd < 0)
		return 0;

	EVUTIL_ASSERT(fd == ev->ev_fd);

#ifndef EVMAP_USE_HT
	if (fd >= io->nentries)
		return (-1);
#endif

	GET_IO_SLOT(ctx, io, fd, evmap_io);

	nread = ctx->nread;
	nwrite = ctx->nwrite;
	nclose = ctx->nclose;

	if (nread)
		old |= EV_READ;
	if (nwrite)
		old |= EV_WRITE;
	if (nclose)
		old |= EV_CLOSED;

	if (ev->ev_events & EV_READ) {
		if (--nread == 0)
			res |= EV_READ;
		EVUTIL_ASSERT(nread >= 0);
	}
	if (ev->ev_events & EV_WRITE) {
		if (--nwrite == 0)
			res |= EV_WRITE;
		EVUTIL_ASSERT(nwrite >= 0);
	}
	if (ev->ev_events & EV_CLOSED) {
		if (--nclose == 0)
			res |= EV_CLOSED;
		EVUTIL_ASSERT(nclose >= 0);
	}

	if (res) {
		void *extra = ((char*)ctx) + sizeof(struct evmap_io);
		if (evsel->del(base, ev->ev_fd,
			old, (ev->ev_events & EV_ET) | res, extra) == -1) {
			retval = -1;
		} else {
			retval = 1;
		}
	}

	ctx->nread = nread;
	ctx->nwrite = nwrite;
	ctx->nclose = nclose;
	LIST_REMOVE(ev, ev_io_next);

	return (retval);
}